

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpectrumPlus3.cpp
# Opt level: O3

bool MatchBlock(uint8_t *pbInput_,uint8_t *pbMatch_,char *psczRules_)

{
  uint8_t uVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *psczRules_;
  if (cVar2 != '\0') {
    pcVar3 = psczRules_ + 1;
    do {
      if (cVar2 == 'n') {
LAB_0016f8cc:
        pbInput_ = pbInput_ + 1;
        pbMatch_ = pbMatch_ + 1;
      }
      else if (cVar2 == 'o') {
        uVar1 = *pbMatch_;
        pbMatch_ = pbMatch_ + 1;
        pbInput_ = pbInput_ + (*pbInput_ == uVar1);
      }
      else if (cVar2 == 'y') {
        if (*pbInput_ != *pbMatch_) {
          return false;
        }
        goto LAB_0016f8cc;
      }
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return true;
}

Assistant:

static bool MatchBlock(const uint8_t* pbInput_, const uint8_t* pbMatch_, const char* psczRules_)
{
    while (*psczRules_)
    {
        switch (*psczRules_++)
        {
            // Character must match
        case 'y':
            if (*pbInput_++ != *pbMatch_++)
                return false;
            break;

            // Character not expected to match
        case 'n':
            ++pbInput_;
            ++pbMatch_;
            break;

            // Skip optional input if matched
        case 'o':
            if (*pbInput_ == *pbMatch_++)
                ++pbInput_;
            break;
        }
    }

    // Fully matched
    return true;
}